

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

void read_path(char **r,char *start)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = *r;
  do {
    if (pcVar2 < start) {
      return;
    }
    cVar1 = *pcVar2;
    pcVar2 = pcVar2 + -1;
    *r = pcVar2;
  } while (cVar1 != '/');
  return;
}

Assistant:

static void read_path(char *&r, char *start)
{
    while(1)
    {
        if(r<start)
            break;
        bool doBreak = *r=='/';
        r--;
        if(doBreak)
            break;
    }
}